

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

Hcell * Hcell::functor(Hcell *__return_storage_ptr__,Functor *f)

{
  (__return_storage_ptr__->f_).id._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->f_).id.field_2;
  *(undefined4 *)&(__return_storage_ptr__->f_).id.field_2 = 0x62726167;
  *(undefined4 *)((long)&(__return_storage_ptr__->f_).id.field_2 + 3) = 0x65676162;
  (__return_storage_ptr__->f_).id._M_string_length = 7;
  (__return_storage_ptr__->f_).id.field_2._M_local_buf[7] = '\0';
  (__return_storage_ptr__->f_).arity = -0x2a;
  __return_storage_ptr__->tag = Functor;
  __return_storage_ptr__->hix_ = -0x2a;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->f_);
  (__return_storage_ptr__->f_).arity = f->arity;
  return __return_storage_ptr__;
}

Assistant:

static Hcell functor(Functor f) {
        Hcell h;
        h.tag = Htag::Functor;
        h.f_ = f;
        return h;
    }